

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

double Minisat::memUsedPeak(bool strictlyPeak)

{
  int iVar1;
  byte in_DIL;
  double peak;
  double local_18;
  
  iVar1 = memReadPeak();
  local_18 = (double)iVar1 / 1024.0;
  if (((local_18 == 0.0) && (!NAN(local_18))) && ((in_DIL & 1) == 0)) {
    local_18 = memUsed();
  }
  return local_18;
}

Assistant:

double Minisat::memUsedPeak(bool strictlyPeak) { 
    double peak = memReadPeak() / (double)1024;
    return peak == 0 && !strictlyPeak ? memUsed() : peak; }